

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_writemap.cpp
# Opt level: O3

void Cmd_dumpmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  char *__filename;
  FILE *__stream;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar13;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  wadinfo_t header;
  wadlump_t lumps [12];
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 local_114;
  undefined2 local_110;
  short local_10c;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  char local_f0 [8];
  undefined4 local_e8;
  undefined8 local_e4;
  undefined2 local_dc;
  undefined4 local_d8;
  int local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  int local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  int local_b4;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined1 local_7c;
  undefined4 local_78;
  int local_74;
  undefined4 local_70;
  undefined3 uStack_6c;
  undefined4 local_68;
  undefined8 local_64;
  undefined2 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  
  uStack_130 = 0x587be5;
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 < 2) {
    pcVar6 = "Usage: dumpmap <wadname> [mapname]\n";
  }
  else {
    if (gamestate == GS_LEVEL) {
      uStack_130 = 0x587c26;
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 < 3) {
        pcVar6 = "MAP01";
        if (((byte)gameinfo.flags & 1) == 0) {
          pcVar6 = "E1M1";
        }
      }
      else {
        uStack_130 = 0x587c56;
        pcVar6 = FCommandLine::operator[](argv,2);
      }
      uStack_130 = 0x587c66;
      __filename = FCommandLine::operator[](argv,1);
      uStack_130 = 0x587c75;
      __stream = fopen(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        uStack_130 = 0x58830c;
        pcVar6 = FCommandLine::operator[](argv,1);
        Printf("Cannot write %s\n",pcVar6);
        return;
      }
      local_100 = 0;
      local_108 = 0xc44415750;
      uStack_130 = 0x587caa;
      memset(&local_f8,0,0xc0);
      uStack_130 = 0x587cb9;
      fseek(__stream,0xc,0);
      local_f8 = 0xc;
      uStack_130 = 0x587cd0;
      uppercopy(local_f0,pcVar6);
      uStack_130 = 0x587cd8;
      lVar4 = ftell(__stream);
      local_e8 = (undefined4)lVar4;
      local_118 = 0;
      lVar4 = (&players)[(long)consoleplayer * 0x54];
      auVar8._0_4_ = (int)*(double *)(lVar4 + 0x48);
      auVar8._4_4_ = (int)*(double *)(lVar4 + 0x50);
      auVar8._8_8_ = 0;
      auVar8 = pshuflw(auVar8,auVar8,0xe8);
      local_128 = (ulong)auVar8._0_4_ << 0x10;
      uStack_120._0_6_ = CONCAT42(0x1e70001,(short)(int)*(double *)(lVar4 + 0x90));
      uStack_120 = (ulong)(uint6)uStack_120;
      uStack_130 = 0x587d3c;
      fwrite(&local_128,0x14,1,__stream);
      local_e4 = 0x4e49485400000014;
      local_dc = 0x5347;
      uStack_130 = 0x587d59;
      lVar4 = ftell(__stream);
      local_d8 = (undefined4)lVar4;
      if (0 < numlines) {
        lVar7 = 0;
        lVar4 = 0;
        do {
          lVar5 = local_128;
          local_128._7_1_ = SUB81(lVar5,7);
          local_128._0_7_ =
               CONCAT16((char)lines[lVar4].special,
                        CONCAT24((short)lines[lVar4].flags,
                                 CONCAT22((short)((uint)(*(int *)&lines[lVar4].v2 - (int)vertexes)
                                                 >> 3) * 0x6db7,
                                          (short)((uint)(*(int *)&lines[lVar4].v1 - (int)vertexes)
                                                 >> 3) * 0x6db7)));
          lVar5 = 0xb;
          do {
            *(undefined1 *)((long)&uStack_130 + lVar5 + 4) =
                 *(undefined1 *)((long)lines->args + lVar5 * 4 + lVar7 + -0x2c);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x10);
          uStack_120._0_6_ =
               CONCAT24((short)((uint)(*(int *)lines[lVar4].sidedef - (int)sides) >> 3) * -0x25ed,
                        (undefined4)uStack_120);
          uStack_120 = CONCAT26((short)((uint)(*(int *)(lines[lVar4].sidedef + 1) - (int)sides) >> 3
                                       ) * -0x25ed,(uint6)uStack_120);
          uStack_130 = 0x587e30;
          fwrite(&local_128,0x10,1,__stream);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 0x98;
        } while (lVar4 < numlines);
      }
      local_d4 = numlines << 4;
      local_d0 = 0x53464544454e494c;
      uStack_130 = 0x587e6e;
      lVar4 = ftell(__stream);
      local_c8 = (undefined4)lVar4;
      if (0 < numsides) {
        lVar7 = 0;
        lVar4 = 0;
        do {
          lVar5 = CONCAT44(sides._4_4_,(int)sides);
          pdVar1 = (double *)(lVar5 + 0x40 + lVar7);
          auVar9._0_4_ = (int)*pdVar1;
          auVar9._4_4_ = (int)pdVar1[1];
          auVar9._8_8_ = 0;
          auVar8 = pshuflw(auVar9,auVar9,0xe8);
          local_128 = CONCAT44(local_128._4_4_,auVar8._0_4_);
          local_10c = (short)((uint)(*(int *)(lVar5 + lVar7) - (int)sectors) >> 3) * 0x3885;
          uVar2 = *(uint *)(lVar5 + 0x30 + lVar7);
          pcVar6 = "-";
          if (uVar2 < TexMan.Textures.Count) {
            pcVar6 = "-";
            if (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0) {
              pcVar6 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars;
            }
          }
          uStack_130 = 0x587f02;
          uppercopy((char *)((long)&local_128 + 4),pcVar6);
          uVar2 = *(uint *)(CONCAT44(sides._4_4_,(int)sides) + 0x90 + lVar7);
          pcVar6 = "-";
          if (uVar2 < TexMan.Textures.Count) {
            pcVar6 = "-";
            if (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0) {
              pcVar6 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars;
            }
          }
          uStack_130 = 0x587f39;
          uppercopy((char *)((long)&uStack_120 + 4),pcVar6);
          uVar2 = *(uint *)(CONCAT44(sides._4_4_,(int)sides) + 0x60 + lVar7);
          pcVar6 = "-";
          if (uVar2 < TexMan.Textures.Count) {
            pcVar6 = "-";
            if (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0) {
              pcVar6 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars;
            }
          }
          uStack_130 = 0x587f6d;
          uppercopy((char *)&local_114,pcVar6);
          uStack_130 = 0x587f82;
          fwrite(&local_128,0x1e,1,__stream);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 0xd8;
        } while (lVar4 < numsides);
      }
      local_c4 = numsides * 0x1e;
      local_c0 = 0x5346454445444953;
      uStack_130 = 0x587fc2;
      lVar4 = ftell(__stream);
      local_b8 = (undefined4)lVar4;
      if (0 < numvertexes) {
        lVar7 = 0;
        lVar4 = 0;
        do {
          pdVar1 = (double *)(CONCAT44(vertexes._4_4_,(int)vertexes) + lVar7);
          dVar13 = pdVar1[1] + 103079215104.0;
          auVar10._0_4_ = (undefined4)((ulong)(*pdVar1 + 103079215104.0) >> 0x10);
          auVar10._8_4_ = (undefined4)((ulong)dVar13 >> 0x10);
          auVar10._4_4_ = auVar10._8_4_;
          auVar10._12_2_ = (short)((ulong)dVar13 >> 0x30);
          auVar10._14_2_ = 0;
          auVar8 = pshuflw(auVar10,auVar10,0xe8);
          local_128 = CONCAT44(local_128._4_4_,auVar8._0_4_);
          uStack_130 = 0x58801e;
          fwrite(&local_128,4,1,__stream);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 0x38;
        } while (lVar4 < numvertexes);
      }
      local_b4 = numvertexes << 2;
      local_b0 = 0x5345584554524556;
      uStack_130 = 0x58804b;
      lVar4 = ftell(__stream);
      local_a8 = (undefined4)lVar4;
      local_a4 = 0x5347455300000000;
      uStack_130 = 0x58806c;
      lVar4 = ftell(__stream);
      local_98 = (undefined4)lVar4;
      local_94 = 0;
      local_90 = 0x53524f5443455353;
      uStack_130 = 0x588098;
      lVar4 = ftell(__stream);
      local_88 = (undefined4)lVar4;
      local_84 = 0x45444f4e00000000;
      local_7c = 0x53;
      uStack_130 = 0x5880c1;
      lVar4 = ftell(__stream);
      local_78 = (undefined4)lVar4;
      if (0 < numsectors) {
        lVar7 = 0;
        lVar4 = 0;
        do {
          lVar5 = CONCAT44(sectors._4_4_,(int)sectors);
          auVar11._0_4_ = (int)*(double *)(lVar5 + 0x50 + lVar7);
          auVar11._4_4_ = (int)*(double *)(lVar5 + 0xa8 + lVar7);
          auVar11._8_8_ = 0;
          auVar8 = pshuflw(auVar11,auVar11,0xe8);
          local_128 = CONCAT44(local_128._4_4_,auVar8._0_4_);
          uVar2 = *(uint *)(lVar5 + 0x48 + lVar7);
          pcVar6 = "-";
          if (uVar2 < TexMan.Textures.Count) {
            pcVar6 = "-";
            if (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0) {
              pcVar6 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars;
            }
          }
          uStack_130 = 0x588146;
          uppercopy((char *)((long)&local_128 + 4),pcVar6);
          uVar2 = *(uint *)(CONCAT44(sectors._4_4_,(int)sectors) + 0xa0 + lVar7);
          pcVar6 = "-";
          if (uVar2 < TexMan.Textures.Count) {
            pcVar6 = "-";
            if (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0) {
              pcVar6 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars;
            }
          }
          uStack_130 = 0x58817c;
          uppercopy((char *)((long)&uStack_120 + 4),pcVar6);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(CONCAT44(sectors._4_4_,(int)sectors) + 0x110 + lVar7);
          auVar8 = pshuflw(auVar12,auVar12,0xe1);
          local_114 = auVar8._0_4_;
          uStack_130 = 0x5881a4;
          iVar3 = FTagManager::GetFirstSectorTag
                            (&tagManager,(sector_t *)(CONCAT44(sectors._4_4_,(int)sectors) + lVar7))
          ;
          local_110 = (undefined2)iVar3;
          uStack_130 = 0x5881be;
          fwrite(&local_128,0x1a,1,__stream);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 0x268;
        } while (lVar4 < numsectors);
      }
      local_74 = numsectors * 0x1a;
      local_70 = 0x54434553;
      uStack_6c = 0x53524f;
      uStack_130 = 0x58820d;
      lVar4 = ftell(__stream);
      local_68 = (undefined4)lVar4;
      local_64 = 0x454a455200000000;
      local_5c = 0x5443;
      uStack_130 = 0x588237;
      lVar4 = ftell(__stream);
      local_58 = (undefined4)lVar4;
      local_54 = 0;
      local_50 = 0x50414d4b434f4c42;
      uStack_130 = 0x588262;
      lVar4 = ftell(__stream);
      local_48 = (undefined4)lVar4;
      uStack_130 = 0x588282;
      fwrite(WriteBEHAVIOR(_IO_FILE*)::dummy,0x10,1,__stream);
      local_44 = 0x10;
      local_40 = 0x524f495641484542;
      uStack_130 = 0x5882a6;
      lVar4 = ftell(__stream);
      local_100 = (undefined4)lVar4;
      uStack_130 = 0x5882c4;
      fwrite(&local_f8,0x10,0xc,__stream);
      uStack_130 = 0x5882d0;
      fseek(__stream,0,0);
      uStack_130 = 0x5882e5;
      fwrite(&local_108,0xc,1,__stream);
      uStack_130 = 0x5882ed;
      fclose(__stream);
      return;
    }
    pcVar6 = "You can only dump a map when inside a level.\n";
  }
  Printf(pcVar6);
  return;
}

Assistant:

CCMD (dumpmap)
{
	const char *mapname;
	FILE *file;

	if (argv.argc() < 2)
	{
		Printf ("Usage: dumpmap <wadname> [mapname]\n");
		return;
	}
	
	if (gamestate != GS_LEVEL)
	{
		Printf ("You can only dump a map when inside a level.\n");
		return;
	}

	if (argv.argc() < 3)
	{
		if (gameinfo.flags & GI_MAPxx)
		{
			mapname = "MAP01";
		}
		else
		{
			mapname = "E1M1";
		}
	}
	else
	{
		mapname = argv[2];
	}

	file = fopen (argv[1], "wb");
	if (file == NULL)
	{
		Printf ("Cannot write %s\n", argv[1]);
		return;
	}

	wadinfo_t header = { PWAD_ID, 12, 0 };
	wadlump_t lumps[12] = { {0, 0, {0}} };

	fseek (file, 12, SEEK_SET);
	
	lumps[0].FilePos = LittleLong(12);
	lumps[0].Size = 0;
	uppercopy (lumps[0].Name, mapname);

	APPEND(1, THINGS);
	APPEND(2, LINEDEFS);
	APPEND(3, SIDEDEFS);
	APPEND(4, VERTEXES);
	APPEND(5, SEGS);
	APPEND(6, SSECTORS);
	APPEND(7, NODES);
	APPEND(8, SECTORS);
	APPEND(9, REJECT);
	APPEND(10, BLOCKMAP);
	APPEND(11, BEHAVIOR);

	header.InfoTableOfs = ftell (file);

	fwrite (lumps, 16, 12, file);
	fseek (file, 0, SEEK_SET);
	fwrite (&header, 12, 1, file);

	fclose (file);
}